

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void compare_ult(CPUMIPSState_conflict10 *env,wr_t *pwd,wr_t *pws,wr_t *pwt,uint32_t df,int quiet,
                uintptr_t retaddr)

{
  int32_t *piVar1;
  float_status *pfVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  float32 fVar6;
  float64 fVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  wr_t wx;
  ulong local_48 [2];
  wr_t *local_38;
  
  piVar1 = &(env->active_tc).msacsr;
  *piVar1 = *piVar1 & 0xfffc0fff;
  local_38 = pwd;
  if (df == 2) {
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar10 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      if (quiet == 0) {
        iVar4 = float32_unordered_mips64el(pws->w[lVar10],pwt->w[lVar10],pfVar2);
      }
      else {
        iVar4 = float32_unordered_quiet_mips64el(pws->w[lVar10],pwt->w[lVar10],pfVar2);
      }
      *(uint *)((long)local_48 + lVar10 * 4) = -(uint)(iVar4 != 0);
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar5 = ieee_ex_to_mips_mips64el((uint)bVar3);
      uVar8 = (env->active_tc).msacsr;
      uVar9 = uVar5 & 0xfffffffe;
      if ((uVar8 >> 0x18 & 1) == 0) {
        uVar9 = uVar5;
      }
      if ((bVar3 & 0x40) == 0) {
        uVar9 = uVar5;
      }
      uVar5 = uVar9 | 3;
      if ((uVar8 >> 0x18 & 1) == 0) {
        uVar5 = uVar9;
      }
      if (-1 < (char)bVar3) {
        uVar5 = uVar9;
      }
      uVar11 = (uint)((uVar8 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar12 = uVar11 | uVar5;
      uVar9 = uVar5 & 0xfffffffc;
      if ((uVar11 != 0 || (uVar5 & 1) != 0) || (uVar8 & 0x100) != 0) {
        uVar9 = uVar12;
      }
      if ((uVar5 & 2) == 0) {
        uVar9 = uVar12;
      }
      if ((uVar9 & (uVar8 >> 7 & 0x1f | 0x20)) == 0) {
        uVar5 = uVar9 << 0xc;
LAB_0097fc7a:
        (env->active_tc).msacsr = uVar5 & 0x3f000 | uVar8;
      }
      else if ((uVar8 >> 0x12 & 1) == 0) {
        uVar5 = uVar9 << 0xc | uVar8;
        uVar8 = uVar8 & 0xfff80fff;
        goto LAB_0097fc7a;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar9) != 0) {
        fVar6 = float32_default_nan_mips64el(pfVar2);
        *(float32 *)((long)local_48 + lVar10 * 4) = fVar6 & 0xffffffc0 ^ 0x400000 | uVar9;
      }
      if (*(int *)((long)local_48 + lVar10 * 4) == 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        if (quiet == 0) {
          iVar4 = float32_lt_mips64el(pws->w[lVar10],pwt->w[lVar10],pfVar2);
        }
        else {
          iVar4 = float32_lt_quiet_mips64el(pws->w[lVar10],pwt->w[lVar10],pfVar2);
        }
        *(uint *)((long)local_48 + lVar10 * 4) = -(uint)(iVar4 != 0);
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar5 = ieee_ex_to_mips_mips64el((uint)bVar3);
        uVar8 = (env->active_tc).msacsr;
        uVar9 = uVar5 & 0xfffffffe;
        if ((uVar8 >> 0x18 & 1) == 0) {
          uVar9 = uVar5;
        }
        if ((bVar3 & 0x40) == 0) {
          uVar9 = uVar5;
        }
        uVar5 = uVar9 | 3;
        if ((uVar8 >> 0x18 & 1) == 0) {
          uVar5 = uVar9;
        }
        if (-1 < (char)bVar3) {
          uVar5 = uVar9;
        }
        uVar12 = (uint)((uVar8 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
        uVar11 = uVar12 | uVar5;
        uVar9 = uVar5 & 0xfffffffc;
        if ((uVar12 != 0 || (uVar5 & 1) != 0) || (uVar8 & 0x100) != 0) {
          uVar9 = uVar11;
        }
        if ((uVar5 & 2) == 0) {
          uVar9 = uVar11;
        }
        if ((uVar9 & (uVar8 >> 7 & 0x1f | 0x20)) == 0) {
          uVar5 = uVar9 << 0xc;
LAB_0097fd8b:
          (env->active_tc).msacsr = uVar5 & 0x3f000 | uVar8;
        }
        else if ((uVar8 >> 0x12 & 1) == 0) {
          uVar5 = uVar9 << 0xc | uVar8;
          uVar8 = uVar8 & 0xfff80fff;
          goto LAB_0097fd8b;
        }
        if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar9) != 0) {
          fVar6 = float32_default_nan_mips64el(pfVar2);
          *(float32 *)((long)local_48 + lVar10 * 4) = fVar6 & 0xffffffc0 ^ 0x400000 | uVar9;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
  }
  else {
    if (df != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1729,
                    "void compare_ult(CPUMIPSState *, wr_t *, wr_t *, wr_t *, uint32_t, int, uintptr_t)"
                   );
    }
    pfVar2 = &(env->active_tc).msa_fp_status;
    lVar10 = 0;
    do {
      (env->active_tc).msa_fp_status.float_exception_flags = '\0';
      if (quiet == 0) {
        iVar4 = float64_unordered_mips64el(pws->d[lVar10],pwt->d[lVar10],pfVar2);
      }
      else {
        iVar4 = float64_unordered_quiet_mips64el(pws->d[lVar10],pwt->d[lVar10],pfVar2);
      }
      local_48[lVar10] = -(ulong)(iVar4 != 0);
      bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
      uVar5 = ieee_ex_to_mips_mips64el((uint)bVar3);
      uVar8 = (env->active_tc).msacsr;
      uVar9 = uVar5 & 0xfffffffe;
      if ((uVar8 >> 0x18 & 1) == 0) {
        uVar9 = uVar5;
      }
      if ((bVar3 & 0x40) == 0) {
        uVar9 = uVar5;
      }
      uVar5 = uVar9 | 3;
      if ((uVar8 >> 0x18 & 1) == 0) {
        uVar5 = uVar9;
      }
      if (-1 < (char)bVar3) {
        uVar5 = uVar9;
      }
      uVar12 = (uint)((uVar8 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
      uVar11 = uVar12 | uVar5;
      uVar9 = uVar5 & 0xfffffffc;
      if ((uVar12 != 0 || (uVar5 & 1) != 0) || (uVar8 & 0x100) != 0) {
        uVar9 = uVar11;
      }
      if ((uVar5 & 2) == 0) {
        uVar9 = uVar11;
      }
      if ((uVar9 & (uVar8 >> 7 & 0x1f | 0x20)) == 0) {
        uVar5 = uVar9 << 0xc;
LAB_0097fa29:
        (env->active_tc).msacsr = uVar5 & 0x3f000 | uVar8;
      }
      else if ((uVar8 >> 0x12 & 1) == 0) {
        uVar5 = uVar9 << 0xc | uVar8;
        uVar8 = uVar8 & 0xfff80fff;
        goto LAB_0097fa29;
      }
      if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar9) != 0) {
        fVar7 = float64_default_nan_mips64el(pfVar2);
        local_48[lVar10] = (long)(int)uVar9 | fVar7 & 0xffffffffffffffc0 ^ 0x8000000000000;
      }
      if (local_48[lVar10] == 0) {
        (env->active_tc).msa_fp_status.float_exception_flags = '\0';
        if (quiet == 0) {
          iVar4 = float64_lt_mips64el(pws->d[lVar10],pwt->d[lVar10],pfVar2);
        }
        else {
          iVar4 = float64_lt_quiet_mips64el(pws->d[lVar10],pwt->d[lVar10],pfVar2);
        }
        local_48[lVar10] = -(ulong)(iVar4 != 0);
        bVar3 = (env->active_tc).msa_fp_status.float_exception_flags;
        uVar5 = ieee_ex_to_mips_mips64el((uint)bVar3);
        uVar8 = (env->active_tc).msacsr;
        uVar9 = uVar5 & 0xfffffffe;
        if ((uVar8 >> 0x18 & 1) == 0) {
          uVar9 = uVar5;
        }
        if ((bVar3 & 0x40) == 0) {
          uVar9 = uVar5;
        }
        uVar5 = uVar9 | 3;
        if ((uVar8 >> 0x18 & 1) == 0) {
          uVar5 = uVar9;
        }
        if (-1 < (char)bVar3) {
          uVar5 = uVar9;
        }
        uVar12 = (uint)((uVar8 >> 9 & 1) == 0 & (byte)uVar5 >> 2);
        uVar11 = uVar12 | uVar5;
        uVar9 = uVar5 & 0xfffffffc;
        if ((uVar12 != 0 || (uVar5 & 1) != 0) || (uVar8 & 0x100) != 0) {
          uVar9 = uVar11;
        }
        if ((uVar5 & 2) == 0) {
          uVar9 = uVar11;
        }
        if ((uVar9 & (uVar8 >> 7 & 0x1f | 0x20)) == 0) {
          uVar5 = uVar9 << 0xc;
LAB_0097fb4b:
          (env->active_tc).msacsr = uVar5 & 0x3f000 | uVar8;
        }
        else if ((uVar8 >> 0x12 & 1) == 0) {
          uVar5 = uVar9 << 0xc | uVar8;
          uVar8 = uVar8 & 0xfff80fff;
          goto LAB_0097fb4b;
        }
        if ((((uint)(env->active_tc).msacsr >> 7 & 0x1f | 0x20) & uVar9) != 0) {
          fVar7 = float64_default_nan_mips64el(pfVar2);
          local_48[lVar10] = (long)(int)uVar9 | fVar7 & 0xffffffffffffffc0 ^ 0x8000000000000;
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
  }
  uVar8 = (env->active_tc).msacsr;
  uVar9 = uVar8 >> 7 & 0x1f | 0x20;
  if ((uVar9 & uVar8 >> 0xc) != 0) {
    do_raise_exception(env,(uint32_t)retaddr,(ulong)uVar9);
  }
  (env->active_tc).msacsr = (uVar8 >> 0xc & 0x1f) << 2 | uVar8;
  local_38->d[0] = local_48[0];
  local_38->d[1] = local_48[1];
  return;
}

Assistant:

static inline void compare_ult(CPUMIPSState *env, wr_t *pwd, wr_t *pws,
                               wr_t *pwt, uint32_t df, int quiet,
                               uintptr_t retaddr)
{
    wr_t wx, *pwx = &wx;
    uint32_t i;

    clear_msacsr_cause(env);

    switch (df) {
    case DF_WORD:
        for (i = 0; i < DF_ELEMENTS(DF_WORD); i++) {
            MSA_FLOAT_ULT(pwx->w[i], pws->w[i], pwt->w[i], 32, quiet);
        }
        break;
    case DF_DOUBLE:
        for (i = 0; i < DF_ELEMENTS(DF_DOUBLE); i++) {
            MSA_FLOAT_ULT(pwx->d[i], pws->d[i], pwt->d[i], 64, quiet);
        }
        break;
    default:
        assert(0);
    }

    check_msacsr_cause(env, retaddr);

    msa_move_v(pwd, pwx);
}